

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConvexAlgorithm.cpp
# Opt level: O3

void __thiscall
btPerturbedContactResult::addContactPoint
          (btPerturbedContactResult *this,btVector3 *normalOnBInWorld,btVector3 *pointInWorld,
          btScalar orgDepth)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_60;
  float local_5c;
  float local_58;
  float local_50;
  float local_4c;
  float local_48;
  float local_40;
  float local_3c;
  float local_38;
  float local_30;
  float local_2c;
  float local_28;
  
  fVar11 = normalOnBInWorld->m_floats[0] * orgDepth + pointInWorld->m_floats[0];
  fVar13 = normalOnBInWorld->m_floats[1] * orgDepth + pointInWorld->m_floats[1];
  fVar10 = orgDepth * normalOnBInWorld->m_floats[2] + pointInWorld->m_floats[2];
  if (this->m_perturbA == true) {
    btTransform::inverse(&this->m_transformA);
    fVar16 = (this->m_unPerturbedTransform).m_basis.m_el[2].m_floats[0];
    fVar1 = (this->m_unPerturbedTransform).m_basis.m_el[2].m_floats[1];
    fVar2 = (this->m_unPerturbedTransform).m_basis.m_el[2].m_floats[2];
    fVar12 = (local_38 * fVar2 + local_58 * fVar16 + local_48 * fVar1) * fVar10 +
             (local_40 * fVar2 + local_60 * fVar16 + local_50 * fVar1) * fVar11 +
             (local_3c * fVar2 + local_5c * fVar16 + local_4c * fVar1) * fVar13 +
             fVar2 * local_28 + fVar16 * local_30 + fVar1 * local_2c +
             (this->m_unPerturbedTransform).m_origin.m_floats[2];
    fVar15 = (this->m_unPerturbedTransform).m_basis.m_el[0].m_floats[1];
    fVar16 = (this->m_unPerturbedTransform).m_basis.m_el[1].m_floats[1];
    fVar3 = (this->m_unPerturbedTransform).m_basis.m_el[0].m_floats[0];
    fVar1 = (this->m_unPerturbedTransform).m_basis.m_el[1].m_floats[0];
    fVar4 = (this->m_unPerturbedTransform).m_basis.m_el[0].m_floats[2];
    fVar2 = (this->m_unPerturbedTransform).m_basis.m_el[1].m_floats[2];
    uVar7 = *(undefined8 *)(this->m_unPerturbedTransform).m_origin.m_floats;
    fVar15 = fVar10 * (local_38 * fVar4 + local_58 * fVar3 + local_48 * fVar15) +
             fVar11 * (local_40 * fVar4 + local_60 * fVar3 + local_50 * fVar15) +
             fVar13 * (local_3c * fVar4 + local_5c * fVar3 + local_4c * fVar15) +
             (float)uVar7 + local_28 * fVar4 + local_30 * fVar3 + local_2c * fVar15;
    fVar16 = fVar10 * (local_38 * fVar2 + local_58 * fVar1 + local_48 * fVar16) +
             fVar11 * (local_40 * fVar2 + local_60 * fVar1 + local_50 * fVar16) +
             fVar13 * (local_3c * fVar2 + local_5c * fVar1 + local_4c * fVar16) +
             (float)((ulong)uVar7 >> 0x20) + local_28 * fVar2 + local_30 * fVar1 + local_2c * fVar16
    ;
    fVar11 = (float)*(undefined8 *)normalOnBInWorld->m_floats;
    fVar13 = (float)((ulong)*(undefined8 *)normalOnBInWorld->m_floats >> 0x20);
    fVar10 = (fVar12 - pointInWorld->m_floats[2]) * normalOnBInWorld->m_floats[2] +
             (fVar15 - pointInWorld->m_floats[0]) * fVar11 +
             fVar13 * (fVar16 - pointInWorld->m_floats[1]);
    local_88._4_4_ = fVar10 * fVar13 + fVar16;
    local_88._0_4_ = fVar10 * fVar11 + fVar15;
    local_88._8_4_ = normalOnBInWorld->m_floats[2] * fVar10 + fVar12;
  }
  else {
    btTransform::inverse(&this->m_transformB);
    local_78 = ZEXT416((uint)local_40);
    fVar16 = (this->m_unPerturbedTransform).m_basis.m_el[2].m_floats[0];
    fVar1 = (this->m_unPerturbedTransform).m_basis.m_el[2].m_floats[1];
    fVar2 = (this->m_unPerturbedTransform).m_basis.m_el[2].m_floats[2];
    fVar15 = pointInWorld->m_floats[1];
    fVar3 = pointInWorld->m_floats[0];
    fVar4 = pointInWorld->m_floats[2];
    fVar14 = (this->m_unPerturbedTransform).m_basis.m_el[0].m_floats[1];
    fVar12 = (this->m_unPerturbedTransform).m_basis.m_el[1].m_floats[1];
    fVar8 = (this->m_unPerturbedTransform).m_basis.m_el[0].m_floats[0];
    fVar5 = (this->m_unPerturbedTransform).m_basis.m_el[1].m_floats[0];
    fVar9 = (this->m_unPerturbedTransform).m_basis.m_el[0].m_floats[2];
    fVar6 = (this->m_unPerturbedTransform).m_basis.m_el[1].m_floats[2];
    uVar7 = *(undefined8 *)(this->m_unPerturbedTransform).m_origin.m_floats;
    fVar14 = fVar4 * (local_38 * fVar9 + local_58 * fVar8 + local_48 * fVar14) +
             fVar3 * (local_40 * fVar9 + local_60 * fVar8 + local_50 * fVar14) +
             fVar15 * (local_3c * fVar9 + local_5c * fVar8 + local_4c * fVar14) +
             (float)uVar7 + local_28 * fVar9 + local_30 * fVar8 + local_2c * fVar14;
    fVar12 = fVar4 * (local_38 * fVar6 + local_58 * fVar5 + local_48 * fVar12) +
             fVar3 * (local_40 * fVar6 + local_60 * fVar5 + local_50 * fVar12) +
             fVar15 * (local_3c * fVar6 + local_5c * fVar5 + local_4c * fVar12) +
             (float)((ulong)uVar7 >> 0x20) + local_28 * fVar6 + local_30 * fVar5 + local_2c * fVar12
    ;
    fVar16 = (local_38 * fVar2 + local_58 * fVar16 + local_48 * fVar1) * fVar4 +
             (local_40 * fVar2 + local_60 * fVar16 + local_50 * fVar1) * fVar3 +
             (local_3c * fVar2 + local_5c * fVar16 + local_4c * fVar1) * fVar15 +
             fVar2 * local_28 + fVar16 * local_30 + fVar1 * local_2c +
             (this->m_unPerturbedTransform).m_origin.m_floats[2];
    local_88._4_4_ = fVar12;
    local_88._0_4_ = fVar14;
    local_88._8_4_ = fVar16;
    fVar10 = (fVar10 - fVar16) * normalOnBInWorld->m_floats[2] +
             (fVar11 - fVar14) * normalOnBInWorld->m_floats[0] +
             (fVar13 - fVar12) * normalOnBInWorld->m_floats[1];
  }
  local_88._12_4_ = 0;
  (*(this->m_originalManifoldResult->super_Result)._vptr_Result[4])
            (fVar10,this->m_originalManifoldResult,normalOnBInWorld,local_88);
  return;
}

Assistant:

virtual void addContactPoint(const btVector3& normalOnBInWorld,const btVector3& pointInWorld,btScalar orgDepth)
	{
		btVector3 endPt,startPt;
		btScalar newDepth;
		btVector3 newNormal;

		if (m_perturbA)
		{
			btVector3 endPtOrg = pointInWorld + normalOnBInWorld*orgDepth;
			endPt = (m_unPerturbedTransform*m_transformA.inverse())(endPtOrg);
			newDepth = (endPt -  pointInWorld).dot(normalOnBInWorld);
			startPt = endPt+normalOnBInWorld*newDepth;
		} else
		{
			endPt = pointInWorld + normalOnBInWorld*orgDepth;
			startPt = (m_unPerturbedTransform*m_transformB.inverse())(pointInWorld);
			newDepth = (endPt -  startPt).dot(normalOnBInWorld);
			
		}

//#define DEBUG_CONTACTS 1
#ifdef DEBUG_CONTACTS
		m_debugDrawer->drawLine(startPt,endPt,btVector3(1,0,0));
		m_debugDrawer->drawSphere(startPt,0.05,btVector3(0,1,0));
		m_debugDrawer->drawSphere(endPt,0.05,btVector3(0,0,1));
#endif //DEBUG_CONTACTS

		
		m_originalManifoldResult->addContactPoint(normalOnBInWorld,startPt,newDepth);
	}